

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_daemon.c
# Opt level: O1

int zt_daemonize(char *root,mode_t mask,int options)

{
  __pid_t _Var1;
  int iVar2;
  int iVar3;
  int *piVar4;
  char *fmt;
  zt_log_level level;
  ulong uVar5;
  int status;
  rlimit local_38;
  
  _Var1 = fork();
  if (_Var1 == 0) {
    _Var1 = setsid();
    if (_Var1 == -1) {
      piVar4 = __errno_location();
      root = strerror(*piVar4);
      fmt = "faild to setsid(): %s";
      goto LAB_00123989;
    }
    local_38.rlim_cur = 0;
    local_38.rlim_max = 0;
    iVar2 = getrlimit(RLIMIT_NOFILE,&local_38);
    if (iVar2 == -1) {
      piVar4 = __errno_location();
      root = strerror(*piVar4);
      fmt = "faild to getlimit(): %s";
      goto LAB_00123989;
    }
    if (local_38.rlim_cur != 0) {
      uVar5 = 0;
      do {
        if (0x7ffffffe < uVar5) {
          uVar5 = 0x7fffffff;
        }
        close((int)uVar5);
        uVar5 = uVar5 + 1;
      } while (uVar5 < local_38.rlim_cur);
    }
    _Var1 = fork();
    if (_Var1 != 0) {
      if (_Var1 != -1) {
        sleep(1);
        goto LAB_0012395a;
      }
      goto LAB_00123997;
    }
    if (root == (char *)0x0) {
LAB_001238bc:
      umask(mask);
      iVar2 = open("/dev/null",2);
      iVar3 = dup(iVar2);
      if (iVar3 == -1) {
        zt_log_lprintf((zt_log_ty *)0x0,zt_log_crit,"Could not send stdout to /dev/null");
      }
      iVar2 = dup(iVar2);
      if (iVar2 == -1) {
        zt_log_lprintf((zt_log_ty *)0x0,zt_log_crit,"Could not send stderr to /dev/null");
      }
      return 0;
    }
    iVar2 = chdir(root);
    if (iVar2 == 0) goto LAB_001238bc;
    fmt = "Could not chdir %s";
    level = zt_log_crit;
  }
  else {
    if (_Var1 != -1) {
      wait(&local_38);
LAB_0012395a:
      exit(0);
    }
    piVar4 = __errno_location();
    root = strerror(*piVar4);
    fmt = "failed to fork(): %s";
LAB_00123989:
    level = zt_log_emerg;
  }
  zt_log_lprintf((zt_log_ty *)0x0,level,fmt,root);
LAB_00123997:
  exit(1);
}

Assistant:

int
zt_daemonize( char *root, mode_t mask, int options UNUSED)
{
    pid_t         pid;
    pid_t         pid2;
    rlim_t        i;
    int           status;
    struct rlimit rlimits;

    if ((pid = fork()) == (pid_t)(-1)) { /* first error */
        zt_log_printf(zt_log_emerg, "failed to fork(): %s", strerror(errno));
        exit(1);
    } else if (pid == 0) {  /* first child */
        /* FIXME: Not everyone has setsid.  Add support for them. */
        if (setsid() == -1) {
            zt_log_printf(zt_log_emerg, "faild to setsid(): %s", strerror(errno));
            exit(1);
        }

        /* get the max number of open fd and close them */
        memset(&rlimits, 0, sizeof(struct rlimit));
        if (getrlimit(RLIMIT_NOFILE, &rlimits) == -1) {
            zt_log_printf(zt_log_emerg, "faild to getlimit(): %s", strerror(errno));
            exit(1);
        }
        for (i = 0; i < rlimits.rlim_cur; i++) {
            if (i > INT_MAX) {
                /* int cast protection */
                i = INT_MAX;
            }
            close((int)i);
        }                                                  /* Close all of the filehandles */

        if ((pid2 = fork()) == (pid_t)(-1)) {
            /* We can't produce an error here as we have already
             * closed all of the file descriptors
             */
            exit(1);
        } else if (pid2 == 0) { /* second child */
            int fd;

            if (root != NULL) {
                if(chdir(root) != 0) {
                    zt_log_printf(zt_log_crit, "Could not chdir %s", root);
                    exit(1);
                }
            }
            umask(mask);
            fd = open("/dev/null", O_RDWR);    /* stdin */

            /* we don't care about the results as we have no open pids at this point */
            if(dup(fd) == -1) { /* stdout */
              zt_log_printf(zt_log_crit, "Could not send stdout to /dev/null");
            }

            if(dup(fd) == -1) { /* stderr */
              zt_log_printf(zt_log_crit, "Could not send stderr to /dev/null");
            }

        } else {                                           /* second parent */
            sleep(1);
            exit(0);
        }
    } else {    /* first parent */
        /* wait here for the first child to exit */
        wait(&status);
        exit(0);
    }

    /* At this point we are in the second child properly forked and closed off */
    return 0;
}